

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::default_cost_type<double>::make_l2_norm(default_cost_type<double> *this,int n)

{
  double dVar1;
  bool bVar2;
  type pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int local_28;
  int local_24;
  int i_1;
  int i;
  double div;
  int n_local;
  default_cost_type<double> *this_local;
  
  _i_1 = 0.0;
  for (local_24 = 0; local_24 != n; local_24 = local_24 + 1) {
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->linear_elements,(long)local_24);
    dVar1 = *pdVar3;
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->linear_elements,(long)local_24);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *pdVar3;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = _i_1;
    auVar4 = vfmadd213sd_fma(auVar4,auVar5,auVar6);
    _i_1 = auVar4._0_8_;
  }
  bVar2 = std::isnormal(_i_1);
  if (bVar2) {
    for (local_28 = 0; local_28 != n; local_28 = local_28 + 1) {
      pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         (&this->linear_elements,(long)local_28);
      *pdVar3 = *pdVar3 / _i_1;
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }